

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss_pyramid.h
# Opt level: O2

void gimage::reduceGauss<unsigned_char,unsigned_char>
               (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *target,
               Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image)

{
  float fVar1;
  byte bVar2;
  work_t wVar3;
  byte *pbVar4;
  long lVar5;
  float *pfVar6;
  long lVar7;
  uchar *puVar8;
  long lVar9;
  long lVar10;
  long k;
  long lVar11;
  int d;
  long lVar12;
  work_t wVar13;
  float fVar14;
  long local_90;
  ImageFloat tmp;
  
  Image<float,_gimage::PixelTraits<float>_>::Image(&tmp,(image->width + 1) / 2,image->height,1);
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
            (target,(image->width + 1) / 2,(image->height + 1) / 2,(long)image->depth);
  for (lVar12 = 0; lVar12 < image->depth; lVar12 = lVar12 + 1) {
    pfVar6 = **tmp.img;
    for (lVar11 = 0; lVar11 < image->height; lVar11 = lVar11 + 1) {
      lVar7 = -2;
      for (lVar9 = 0; lVar9 < image->width; lVar9 = lVar9 + 2) {
        if (lVar9 == 0 || image->width + -2 <= lVar9) {
          fVar14 = 0.0;
          lVar5 = lVar7;
          for (lVar10 = 0; lVar10 != 0x14; lVar10 = lVar10 + 4) {
            fVar1 = *(float *)((long)reduceGauss<unsigned_char,_unsigned_char>::g + lVar10);
            wVar3 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                              (image,lVar5,lVar11,(int)lVar12);
            fVar14 = fVar14 + fVar1 * (float)wVar3;
            lVar5 = lVar5 + 1;
          }
        }
        else {
          pbVar4 = image->img[lVar12][lVar11] + lVar9 + -2;
          fVar14 = 0.0;
          for (lVar5 = 0; lVar5 != 0x14; lVar5 = lVar5 + 4) {
            bVar2 = *pbVar4;
            pbVar4 = pbVar4 + 1;
            fVar14 = fVar14 + (float)bVar2 *
                              *(float *)((long)reduceGauss<unsigned_char,_unsigned_char>::g + lVar5)
            ;
          }
        }
        *pfVar6 = fVar14;
        pfVar6 = pfVar6 + 1;
        lVar7 = lVar7 + 2;
      }
    }
    local_90 = 0;
    for (lVar11 = 0; lVar11 < tmp.width; lVar11 = lVar11 + 1) {
      puVar8 = *target->img[lVar12] + lVar11;
      lVar7 = -2;
      for (lVar9 = 0; lVar9 < tmp.height; lVar9 = lVar9 + 2) {
        if (lVar9 == 0 || tmp.height + -2 <= lVar9) {
          fVar14 = 0.0;
          lVar5 = lVar7;
          for (lVar10 = 0; lVar10 != 0x14; lVar10 = lVar10 + 4) {
            wVar13 = Image<float,_gimage::PixelTraits<float>_>::getBounds(&tmp,lVar11,lVar5,0);
            fVar14 = fVar14 + wVar13 * *(float *)((long)reduceGauss<unsigned_char,_unsigned_char>::g
                                                 + lVar10);
            lVar5 = lVar5 + 1;
          }
        }
        else {
          pfVar6 = (float *)((long)(*tmp.img)[lVar9 + -2] + local_90);
          fVar14 = 0.0;
          for (lVar5 = 0; lVar5 != 0x14; lVar5 = lVar5 + 4) {
            fVar14 = fVar14 + *(float *)((long)reduceGauss<unsigned_char,_unsigned_char>::g + lVar5)
                              * *pfVar6;
            pfVar6 = pfVar6 + tmp.width;
          }
        }
        *puVar8 = (uchar)(int)fVar14;
        puVar8 = puVar8 + target->width;
        lVar7 = lVar7 + 2;
      }
      local_90 = local_90 + 4;
    }
  }
  Image<float,_gimage::PixelTraits<float>_>::~Image(&tmp);
  return;
}

Assistant:

void reduceGauss(Image<T> &target, const Image<S> &image)
{
  static const float g[]={0.0625, 0.25, 0.375, 0.25, 0.0625};

  // intermediate image with downscaled width

  ImageFloat tmp((image.getWidth()+1)/2, image.getHeight(), 1);

  // downscaled target image

  target.setSize((image.getWidth()+1)/2, (image.getHeight()+1)/2, image.getDepth());

  // for all color channels

  for (int d=0; d<image.getDepth(); d++)
  {
    // convolve horizontal into horizontally downscaled intermediate image

    float *tmpp=tmp.getPtr(0, 0, 0);
    for (long k=0; k<image.getHeight(); k++)
    {
      for (long i=0; i<image.getWidth(); i+=2)
      {
        float pv=0;

        if (i >= 2 && i < image.getWidth()-2)
        {
          S *p=image.getPtr(i-2, k, d);
          for (long j=0; j<5; j++)
          {
            pv+=g[j]* *p++;
          }
        }
        else
        {
          for (long j=0; j<5; j++)
          {
            pv+=g[j]*image.getBounds(i+j-2, k, d);
          }
        }

        *tmpp++=pv;
      }
    }

    // convolve vertically into downscaled target image

    for (long i=0; i<tmp.getWidth(); i++)
    {
      T *tp=target.getPtr(i, 0, d);
      for (long k=0; k<tmp.getHeight(); k+=2)
      {
        float pv=0;

        if (k >= 2 && k < tmp.getHeight()-2)
        {
          float *p=tmp.getPtr(i, k-2, 0);
          for (long j=0; j<5; j++)
          {
            pv+=g[j]* *p;
            p+=tmp.getWidth();
          }
        }
        else
        {
          for (long j=0; j<5; j++)
          {
            pv+=g[j]*tmp.getBounds(i, k+j-2, 0);
          }
        }

        *tp=static_cast<T>(pv);
        tp+=target.getWidth();
      }
    }
  }
}